

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall If_If_Test::~If_If_Test(If_If_Test *this)

{
  If_If_Test *this_local;
  
  ~If_If_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(If, If) {
	MockParser mock(
		"let a = 3\n"
		"if a == 3 {\n"
		"  let b = 4\n"
		"}\n"
		"let c = 5\n"
	);

	INS2(BC_SET_N, 0, 0);

	INS2(BC_NEQ_LN, 0, 0); // If condition
	JMP(2); // Jump to after
	INS2(BC_SET_N, 1, 1); // If body

	INS2(BC_SET_N, 1, 2); // After

	INS(BC_RET, 0, 0, 0);
}